

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

char * SSL_get_psk_identity(SSL *s)

{
  SSL_SESSION *pSVar1;
  SSL_SESSION *session;
  SSL *ssl_local;
  
  if (s == (SSL *)0x0) {
    ssl_local = (SSL *)0x0;
  }
  else {
    pSVar1 = SSL_get_session(s);
    if (pSVar1 == (SSL_SESSION *)0x0) {
      ssl_local = (SSL *)0x0;
    }
    else {
      ssl_local = (SSL *)std::unique_ptr<char,_bssl::internal::Deleter>::get
                                   ((unique_ptr<char,_bssl::internal::Deleter> *)
                                    pSVar1->krb5_client_princ);
    }
  }
  return (char *)ssl_local;
}

Assistant:

const char *SSL_get_psk_identity(const SSL *ssl) {
  if (ssl == NULL) {
    return NULL;
  }
  SSL_SESSION *session = SSL_get_session(ssl);
  if (session == NULL) {
    return NULL;
  }
  return session->psk_identity.get();
}